

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall cppcms::xss::uri_parser::relative_ref(uri_parser *this)

{
  bool bVar1;
  uri_parser *in_RDI;
  save_point sp2_1;
  save_point sp2;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  save_point local_40;
  uri_parser *in_stack_ffffffffffffffd8;
  save_point local_20;
  bool local_1;
  
  bVar1 = relative_part(in_stack_ffffffffffffffd8);
  if (bVar1) {
    save_point::save_point(&local_20,in_RDI);
    bVar1 = follows(in_RDI,'?');
    if ((bVar1) &&
       (bVar1 = query((uri_parser *)
                      CONCAT17(in_stack_ffffffffffffffb7,
                               CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0))),
       bVar1)) {
      save_point::commit(&local_20);
    }
    save_point::~save_point(&local_20);
    save_point::save_point(&local_40,in_RDI);
    bVar1 = follows(in_RDI,'#');
    if ((bVar1) && (bVar1 = fragment((uri_parser *)0x46e3b5), bVar1)) {
      save_point::commit(&local_40);
    }
    save_point::~save_point(&local_40);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool relative_ref()
		{
			if(!relative_part())
				return false;

			{
				save_point sp2(this);
				if(follows('?') && query())
					sp2.commit();
			}

			{
				save_point sp2(this);
				if(follows('#') && fragment())
					sp2.commit();
			}
			return true;
		}